

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexfloat.c
# Opt level: O2

int_t flexfloat_rounding_value(flexfloat_t *a,int_fast16_t exp,_Bool sign)

{
  uint_t uVar1;
  
  if (((ulong)a->value & 0x7ff0000000000000) != 0) {
    if (exp < 1) {
      exp = 1;
    }
    uVar1 = flexfloat_pack(a->desc,sign,exp - (ulong)(a->desc).frac_bits,0);
    return uVar1;
  }
  return (1L << (0x34 - (a->desc).frac_bits & 0x3f)) + ((ulong)sign << 0x3f);
}

Assistant:

int_t flexfloat_rounding_value(const flexfloat_t *a, int_fast16_t exp, bool sign)
{
    if(EXPONENT(CAST_TO_INT(a->value)) == 0) // Denorm backend format
    {
        return flexfloat_denorm_pack(a->desc, sign, 0x1);
    }
    else if(exp <= 0) // Denorm target format
    {
        return flexfloat_pack(a->desc, sign, - a->desc.frac_bits + 1 , 0);
    }
    else
    {
        return flexfloat_pack(a->desc, sign, exp - a->desc.frac_bits , 0);
    }

}